

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_oram_opt.h
# Opt level: O2

int __thiscall CircuitOramOpt::access(CircuitOramOpt *this,char *__name,int __type)

{
  bool bVar1;
  int iVar2;
  int path;
  undefined7 extraout_var;
  int i;
  
  iVar2 = (int)__name;
  bVar1 = TreeOram::readAndRemove((TreeOram *)this,iVar2);
  Bucket<int>::add((this->super_CircuitOram).super_TreeOram.stash,iVar2);
  TreeOram::update_pos((TreeOram *)this,iVar2);
  iVar2 = this->cnt2 + 1;
  this->cnt2 = iVar2;
  if (iVar2 == this->naccess) {
    this->cnt2 = 0;
    for (iVar2 = 0; iVar2 < this->nevict; iVar2 = iVar2 + 1) {
      path = reverse_order(this);
      CircuitOram::flush(&this->super_CircuitOram,path);
    }
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool access(int identifier)
      {
         bool res = readAndRemove(identifier);
         stash->add(identifier);
         update_pos(identifier);
         cnt2++;
         if(cnt2 == naccess) {
            cnt2 = 0;
            for(int i = 0; i < nevict; ++i) {
               flush(reverse_order());
            }
         }
         return res;
      }